

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fct.h
# Opt level: O0

double fct_ts__duration(fct_ts_t *ts)

{
  size_t sVar1;
  fct_test_t *test_00;
  double dVar2;
  fct_test_t *test;
  size_t num_itemstest;
  size_t item_itest;
  double tally;
  fct_ts_t *ts_local;
  
  item_itest = 0;
  if (ts == (fct_ts_t *)0x0) {
    __assert_fail("ts != ((void*)0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/imb[P]fctx/include/fct.h",0x54e
                  ,"double fct_ts__duration(const fct_ts_t *)");
  }
  if (ts != (fct_ts_t *)0xfffffffffffffef0) {
    sVar1 = fct_nlist__size(&ts->test_list);
    for (num_itemstest = 0; num_itemstest != sVar1; num_itemstest = num_itemstest + 1) {
      test_00 = (fct_test_t *)fct_nlist__at(&ts->test_list,num_itemstest);
      dVar2 = fct_test__duration(test_00);
      item_itest = (size_t)(dVar2 + (double)item_itest);
    }
  }
  return (double)item_itest;
}

Assistant:

static double
fct_ts__duration(fct_ts_t const *ts)
{
    double tally =0.0;
    FCT_ASSERT( ts != NULL );
    FCT_NLIST_FOREACH_BGN(fct_test_t *, test, &(ts->test_list))
    {
        tally += fct_test__duration(test);
    }
    FCT_NLIST_FOREACH_END();
    return tally;
}